

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

void tt_delta_interpolate
               (int p1,int p2,int ref1,int ref2,FT_Vector *in_points,FT_Vector *out_points)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  FT_Long FVar5;
  long lVar6;
  FT_Vector *pFVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  FT_Vector *pFVar14;
  bool bVar15;
  
  if (p1 <= p2) {
    pFVar7 = in_points + p1;
    pFVar14 = out_points + p1;
    lVar12 = 8;
    lVar10 = 0;
    do {
      in_points = (FT_Vector *)(&in_points->x + lVar10);
      iVar8 = ref2;
      if (in_points[ref2].x < in_points[ref1].x) {
        iVar8 = ref1;
      }
      out_points = (FT_Vector *)(&out_points->x + lVar10);
      if (in_points[ref2].x < in_points[ref1].x) {
        ref1 = ref2;
      }
      lVar1 = in_points[ref1].x;
      lVar2 = in_points[iVar8].x;
      lVar3 = out_points[ref1].x;
      lVar4 = out_points[iVar8].x;
      if ((lVar2 != lVar1) || (lVar4 == lVar3)) {
        if (lVar2 - lVar1 == 0) {
          lVar6 = 0;
        }
        else {
          FVar5 = FT_DivFix(lVar4 - lVar3,lVar2 - lVar1);
          lVar6 = (long)(int)FVar5;
        }
        lVar9 = 0;
        iVar13 = (p2 - p1) + 1;
        do {
          lVar11 = *(long *)((long)&pFVar7->x + lVar9);
          if (lVar1 < lVar11) {
            if (lVar11 < lVar2) {
              lVar11 = ((int)lVar11 - (int)lVar1) * lVar6;
              lVar11 = (int)((ulong)(lVar11 + (lVar11 >> 0x3f) + 0x8000) >> 0x10) + lVar3;
            }
            else {
              lVar11 = lVar11 + (lVar4 - lVar2);
            }
          }
          else {
            lVar11 = lVar11 + (lVar3 - lVar1);
          }
          *(long *)((long)&pFVar14->x + lVar9) = lVar11;
          lVar9 = lVar9 + 0x10;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      pFVar7 = (FT_Vector *)((long)&pFVar7->x + lVar12);
      pFVar14 = (FT_Vector *)((long)&pFVar14->x + lVar12);
      lVar12 = lVar12 + 8;
      bVar15 = lVar10 == 0;
      lVar10 = lVar10 + 1;
      ref2 = iVar8;
    } while (bVar15);
  }
  return;
}

Assistant:

static void
  tt_delta_interpolate( int         p1,
                        int         p2,
                        int         ref1,
                        int         ref2,
                        FT_Vector*  in_points,
                        FT_Vector*  out_points )
  {
    int  p, i;

    FT_Pos  out, in1, in2, out1, out2, d1, d2;


    if ( p1 > p2 )
      return;

    /* handle both horizontal and vertical coordinates */
    for ( i = 0; i <= 1; i++ )
    {
      /* shift array pointers so that we can access `foo.y' as `foo.x' */
      in_points  = (FT_Vector*)( (FT_Pos*)in_points + i );
      out_points = (FT_Vector*)( (FT_Pos*)out_points + i );

      if ( in_points[ref1].x > in_points[ref2].x )
      {
        p    = ref1;
        ref1 = ref2;
        ref2 = p;
      }

      in1  = in_points[ref1].x;
      in2  = in_points[ref2].x;
      out1 = out_points[ref1].x;
      out2 = out_points[ref2].x;
      d1   = out1 - in1;
      d2   = out2 - in2;

      /* If the reference points have the same coordinate but different */
      /* delta, inferred delta is zero.  Otherwise interpolate.         */
      if ( in1 != in2 || out1 == out2 )
      {
        FT_Fixed  scale = in1 != in2 ? FT_DivFix( out2 - out1, in2 - in1 )
                                     : 0;


        for ( p = p1; p <= p2; p++ )
        {
          out = in_points[p].x;

          if ( out <= in1 )
            out += d1;
          else if ( out >= in2 )
            out += d2;
          else
            out = out1 + FT_MulFix( out - in1, scale );

          out_points[p].x = out;
        }
      }
    }
  }